

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  Option *in_stack_000004a8;
  int in_stack_000004b0;
  int in_stack_000004b4;
  Mat *in_stack_000004b8;
  Mat *in_stack_000004c0;
  
  conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse
            (in_stack_000004c0,in_stack_000004b8,in_stack_000004b4,in_stack_000004b0,
             in_stack_000004a8);
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(kernel, kernel_tm, inch, outch, opt);
}